

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

int __thiscall wabt::Const::lane_count(Const *this)

{
  Enum EVar1;
  Type local_20;
  Const *local_18;
  Const *this_local;
  
  local_18 = this;
  local_20 = lane_type(this);
  EVar1 = Type::operator_cast_to_Enum(&local_20);
  switch(EVar1) {
  case I16:
    this_local._4_4_ = 8;
    break;
  case I8:
    this_local._4_4_ = 0x10;
    break;
  default:
    abort();
  case F64:
    this_local._4_4_ = 2;
    break;
  case F32:
    this_local._4_4_ = 4;
    break;
  case I64:
    this_local._4_4_ = 2;
    break;
  case I32:
    this_local._4_4_ = 4;
  }
  return this_local._4_4_;
}

Assistant:

int lane_count() const {
    switch (lane_type()) {
      case Type::I8:  return 16;
      case Type::I16: return 8;
      case Type::I32: return 4;
      case Type::I64: return 2;
      case Type::F32: return 4;
      case Type::F64: return 2;
      default: WABT_UNREACHABLE;
    }
  }